

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_states.cpp
# Opt level: O2

void __thiscall duckdb::WindowAggregateStates::Initialize(WindowAggregateStates *this,idx_t count)

{
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_00;
  data_ptr_t pdVar1;
  pointer __p;
  type pVVar2;
  pointer this_01;
  idx_t i;
  ulong uVar3;
  pointer puVar4;
  idx_t local_38;
  pointer local_30;
  
  local_38 = count;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&(this->states).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             count * this->state_size);
  puVar4 = (this->states).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  make_uniq<duckdb::Vector,duckdb::LogicalTypeId_const&,unsigned_long&>
            ((duckdb *)&local_30,&LogicalType::POINTER,&local_38);
  __p = local_30;
  this_00 = &this->statef;
  local_30 = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
            ((__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)this_00,__p);
  ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
            ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&local_30);
  pVVar2 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this_00)
  ;
  pdVar1 = pVVar2->data;
  for (uVar3 = 0; uVar3 < local_38; uVar3 = uVar3 + 1) {
    *(pointer *)(pdVar1 + uVar3 * 8) = puVar4;
    (*(this->aggr).function.initialize)((AggregateFunction *)this,puVar4);
    puVar4 = puVar4 + this->state_size;
  }
  this_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                      (this_00);
  Vector::SetVectorType(this_01,FLAT_VECTOR);
  return;
}

Assistant:

void WindowAggregateStates::Initialize(idx_t count) {
	// Don't leak - every Initialize must be matched with a Destroy
	D_ASSERT(states.empty());

	states.resize(count * state_size);
	auto state_ptr = states.data();

	statef = make_uniq<Vector>(LogicalType::POINTER, count);
	auto state_f_data = FlatVector::GetData<data_ptr_t>(*statef);

	for (idx_t i = 0; i < count; ++i, state_ptr += state_size) {
		state_f_data[i] = state_ptr;
		aggr.function.initialize(aggr.function, state_ptr);
	}

	// Prevent conversion of results to constants
	statef->SetVectorType(VectorType::FLAT_VECTOR);
}